

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

bool __thiscall
rapidjson::internal::
Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
::StartObject(Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
              *this,Context *context)

{
  SizeType SVar1;
  int iVar2;
  ValueType *pVVar3;
  Ch *pCVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SizeType count;
  Context *context_local;
  Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
  *this_local;
  
  if ((this->type_ & 4) == 0) {
    pVVar3 = GetObjectString();
    DisallowedType(this,context,pVVar3);
    context->invalidCode = kValidateErrorType;
    pVVar3 = GetValidateErrorKeyword(kValidateErrorType);
    pCVar4 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(pVVar3);
    context->invalidKeyword = pCVar4;
    this_local._7_1_ = false;
  }
  else {
    if (((this->hasDependencies_ & 1U) != 0) || ((this->hasRequired_ & 1U) != 0)) {
      iVar2 = (*context->factory->_vptr_ISchemaStateFactory[7])();
      context->propertyExist = (bool *)CONCAT44(extraout_var,iVar2);
      memset(context->propertyExist,0,(ulong)this->propertyCount_);
    }
    if (this->patternProperties_ != (PatternProperty *)0x0) {
      SVar1 = this->patternPropertyCount_;
      iVar2 = (*context->factory->_vptr_ISchemaStateFactory[7])();
      context->patternPropertiesSchemas = (SchemaType **)CONCAT44(extraout_var_00,iVar2);
      context->patternPropertiesSchemaCount = 0;
      memset(context->patternPropertiesSchemas,0,(ulong)(SVar1 + 1) << 3);
    }
    this_local._7_1_ = CreateParallelValidator(this,context);
  }
  return this_local._7_1_;
}

Assistant:

bool StartObject(Context& context) const {
        RAPIDJSON_SCHEMA_PRINT(Method, "Schema::StartObject");
        if (!(type_ & (1 << kObjectSchemaType))) {
            DisallowedType(context, GetObjectString());
            RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorType);
        }

        if (hasDependencies_ || hasRequired_) {
            context.propertyExist = static_cast<bool*>(context.factory.MallocState(sizeof(bool) * propertyCount_));
            std::memset(context.propertyExist, 0, sizeof(bool) * propertyCount_);
        }

        if (patternProperties_) { // pre-allocate schema array
            SizeType count = patternPropertyCount_ + 1; // extra for valuePatternValidatorType
            context.patternPropertiesSchemas = static_cast<const SchemaType**>(context.factory.MallocState(sizeof(const SchemaType*) * count));
            context.patternPropertiesSchemaCount = 0;
            std::memset(context.patternPropertiesSchemas, 0, sizeof(SchemaType*) * count);
        }

        return CreateParallelValidator(context);
    }